

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFCodewordDecoder.cpp
# Opt level: O0

int ZXing::Pdf417::CodewordDecoder::GetCodeword(int symbol)

{
  uint uVar1;
  array<unsigned_short,_2787UL> *this;
  unsigned_short *puVar2;
  const_iterator pvVar3;
  const_reference pvVar4;
  uint in_EDI;
  unsigned_short *unaff_retaddr;
  unsigned_short *it;
  unsigned_short *__n;
  int *in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffffc;
  int iVar5;
  
  if ((in_EDI & 0xffff0000) == 0x10000) {
    uVar1 = in_EDI & 0xffff;
    this = (array<unsigned_short,_2787UL> *)
           std::array<unsigned_short,_2787UL>::begin((array<unsigned_short,_2787UL> *)0x2bb47e);
    std::array<unsigned_short,_2787UL>::end((array<unsigned_short,_2787UL> *)0x2bb48f);
    puVar2 = std::lower_bound<unsigned_short_const*,int>
                       (unaff_retaddr,(unsigned_short *)CONCAT44(in_stack_fffffffffffffffc,uVar1),
                        in_stack_fffffffffffffff0);
    __n = puVar2;
    pvVar3 = std::array<unsigned_short,_2787UL>::end((array<unsigned_short,_2787UL> *)0x2bb4bc);
    if ((puVar2 == pvVar3) || (*__n != uVar1)) {
      iVar5 = -1;
    }
    else {
      std::array<unsigned_short,_2787UL>::begin((array<unsigned_short,_2787UL> *)0x2bb4ec);
      pvVar4 = std::array<unsigned_short,_2787UL>::operator[](this,(size_type)__n);
      iVar5 = (int)(*pvVar4 - 1) % 0x3a1;
    }
  }
  else {
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

int
CodewordDecoder::GetCodeword(int symbol)
{
	if ((symbol & 0xFFFF0000) != 0x10000)
		return -1;
	symbol &= 0xFFFF;
	auto it = std::lower_bound(SYMBOL_TABLE.begin(), SYMBOL_TABLE.end(), symbol);
	if (it != SYMBOL_TABLE.end() && *it == symbol) {
		return (CODEWORD_TABLE[it - SYMBOL_TABLE.begin()] - 1) % NUMBER_OF_CODEWORDS;
	}
	return -1;
}